

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O0

int __thiscall
flow::BasicBlock::verify
          (BasicBlock *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  FILE *pFVar1;
  bool bVar2;
  size_type sVar3;
  string *psVar4;
  undefined8 uVar5;
  undefined7 extraout_var;
  ulong uVar6;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  basic_string_view<char> local_d8;
  string local_c8;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *local_a8;
  __normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  local_a0 [2];
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *local_90;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *local_88;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *local_80;
  __normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  local_78;
  basic_string_view<char> local_70;
  string local_60;
  basic_string_view<char> local_40;
  string local_30;
  BasicBlock *local_10;
  BasicBlock *this_local;
  
  local_10 = this;
  sVar3 = std::
          vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
          ::size(&this->code_);
  pFVar1 = _stderr;
  if (sVar3 == 0) {
    fmt::v5::basic_string_view<char>::basic_string_view
              (&local_40,"BasicBlock {}: verify: Must contain at least one instruction.");
    psVar4 = Value::name_abi_cxx11_(&this->super_Value);
    format_str.size_ = (size_t)psVar4;
    format_str.data_ = (char *)local_40.size_;
    fmt::v5::format<std::__cxx11::string>
              (&local_30,(v5 *)local_40.data_,format_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tbs);
    uVar5 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"%s\n",uVar5);
    std::__cxx11::string::~string((string *)&local_30);
    abort();
  }
  bVar2 = isComplete(this);
  pFVar1 = _stderr;
  if (!bVar2) {
    fmt::v5::basic_string_view<char>::basic_string_view
              (&local_70,"BasicBlock {}: verify: Last instruction must be a terminator instruction."
              );
    psVar4 = Value::name_abi_cxx11_(&this->super_Value);
    format_str_00.size_ = (size_t)psVar4;
    format_str_00.data_ = (char *)local_70.size_;
    fmt::v5::format<std::__cxx11::string>
              (&local_60,(v5 *)local_70.data_,format_str_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tbs);
    uVar5 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"%s\n",uVar5);
    std::__cxx11::string::~string((string *)&local_60);
    abort();
  }
  local_80 = (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)
             std::
             vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
             ::begin(&this->code_);
  local_90 = (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)
             std::
             vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
             ::end(&this->code_);
  local_88 = (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)
             std::
             prev<__gnu_cxx::__normal_iterator<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>*,std::vector<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>,std::allocator<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>>>>>
                       ((__normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                         )local_90,1);
  local_78 = std::
             find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>*,std::vector<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>,std::allocator<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>>>>,flow::BasicBlock::verify()::__0>
                       (local_80,local_88);
  local_a8 = (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)
             std::
             vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
             ::end(&this->code_);
  local_a0[0] = std::
                prev<__gnu_cxx::__normal_iterator<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>*,std::vector<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>,std::allocator<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>>>>>
                          ((__normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                            )local_a8,1);
  bVar2 = __gnu_cxx::operator==(&local_78,local_a0);
  pFVar1 = _stderr;
  uVar6 = CONCAT71(extraout_var,bVar2) ^ 0xff;
  if ((uVar6 & 1) == 0) {
    return (int)uVar6;
  }
  fmt::v5::basic_string_view<char>::basic_string_view
            (&local_d8,
             "BasicBlock {}: verify: Found a terminate instruction in the middle of the block.");
  psVar4 = Value::name_abi_cxx11_(&this->super_Value);
  format_str_01.size_ = (size_t)psVar4;
  format_str_01.data_ = (char *)local_d8.size_;
  fmt::v5::format<std::__cxx11::string>
            (&local_c8,(v5 *)local_d8.data_,format_str_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tbs);
  uVar5 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"%s\n",uVar5);
  std::__cxx11::string::~string((string *)&local_c8);
  abort();
}

Assistant:

void BasicBlock::verify() {
  FLOW_ASSERT(code_.size() > 0, fmt::format("BasicBlock {}: verify: Must contain at least one instruction.", name()));
  FLOW_ASSERT(isComplete(), fmt::format("BasicBlock {}: verify: Last instruction must be a terminator instruction.", name()));
  FLOW_ASSERT(
      std::find_if(code_.begin(), std::prev(code_.end()), [&](std::unique_ptr<Instr>& instr) -> bool {
        return dynamic_cast<TerminateInstr*>(instr.get()) != nullptr;
      }) == std::prev(code_.end()),
      fmt::format("BasicBlock {}: verify: Found a terminate instruction in the middle of the block.", name()));
}